

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

shared_ptr<helics::Core>
helics::CoreFactory::create
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  shared_ptr<helics::Core> sVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000c8;
  CoreType in_stack_000000d4;
  undefined1 in_stack_000000d8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb0;
  
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_RDI,in_RDI);
  create(in_stack_000000d4,(string_view)in_stack_000000d8,in_stack_000000c8);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffffb0);
  sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI
  ;
  return (shared_ptr<helics::Core>)
         sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core> create(std::vector<std::string> args)
{
    return create(CoreType::EXTRACT, gHelicsEmptyString, std::move(args));
}